

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall udpdiscovery::impl::PeerEnv::PeerEnv(PeerEnv *this)

{
  PeerEnv *this_local;
  
  PeerEnvInterface::PeerEnvInterface(&this->super_PeerEnvInterface);
  (this->super_PeerEnvInterface)._vptr_PeerEnvInterface = (_func_int **)&PTR__PeerEnv_00115ca0;
  PeerParameters::PeerParameters(&this->parameters_);
  this->binding_sock_ = -1;
  this->sock_ = -1;
  this->packet_index_ = 0;
  MinimalisticMutex::MinimalisticMutex(&this->lock_);
  this->ref_count_ = 0;
  this->exit_ = false;
  std::__cxx11::string::string((string *)&this->user_data_);
  std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
  list(&this->discovered_peers_);
  return;
}

Assistant:

PeerEnv()
      : binding_sock_(kInvalidSocket),
        sock_(kInvalidSocket),
        packet_index_(0),
        ref_count_(0),
        exit_(false) {}